

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

int64_t duckdb::DatePart::NanosecondsOperator::Operation<duckdb::timestamp_ns_t,long>
                  (timestamp_ns_t input)

{
  ConversionException *this;
  date_t date;
  int32_t nanos;
  dtime_t time;
  
  if ((input.super_timestamp_t.value != 0x7fffffffffffffff) &&
     (input.super_timestamp_t.value != -0x7fffffffffffffff)) {
    Timestamp::Convert(input,&date,&time,&nanos);
    return (long)nanos + (time.micros % 60000000) * 1000;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&time,"Can\'t get nanoseconds of infinite TIMESTAMP",(allocator *)&date);
  ConversionException::ConversionException(this,(string *)&time);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::NanosecondsOperator::Operation(timestamp_ns_t input) {
	if (!Timestamp::IsFinite(input)) {
		throw ConversionException("Can't get nanoseconds of infinite TIMESTAMP");
	}
	date_t date;
	dtime_t time;
	int32_t nanos;
	Timestamp::Convert(input, date, time, nanos);
	// remove everything but the second & nanosecond part
	return (time.micros % Interval::MICROS_PER_MINUTE) * Interval::NANOS_PER_MICRO + nanos;
}